

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_set_negotiated_protocol(ptls_t *tls,char *protocol,size_t protocol_len)

{
  char *local_30;
  char *duped;
  size_t protocol_len_local;
  char *protocol_local;
  ptls_t *tls_local;
  
  local_30 = (char *)0x0;
  if (protocol != (char *)0x0) {
    duped = (char *)protocol_len;
    if (protocol_len == 0) {
      duped = (char *)strlen(protocol);
    }
    local_30 = (char *)malloc((size_t)(duped + 1));
    if (local_30 == (char *)0x0) {
      return 0x201;
    }
    memcpy(local_30,protocol,(size_t)duped);
    local_30[(long)duped] = '\0';
  }
  free(tls->negotiated_protocol);
  tls->negotiated_protocol = local_30;
  return 0;
}

Assistant:

int ptls_set_negotiated_protocol(ptls_t *tls, const char *protocol, size_t protocol_len)
{
    char *duped = NULL;

    if (protocol != NULL) {
        if (protocol_len == 0)
            protocol_len = strlen(protocol);
        if ((duped = malloc(protocol_len + 1)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(duped, protocol, protocol_len);
        duped[protocol_len] = '\0';
    }

    free(tls->negotiated_protocol);
    tls->negotiated_protocol = duped;

    return 0;
}